

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::AddBignum(Bignum *this,Bignum *other)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  Chunk CVar5;
  ulong uVar6;
  long lVar7;
  short sVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  
  Align(this,other);
  iVar3 = (int)this->used_bigits_ + (int)this->exponent_;
  iVar9 = (int)other->exponent_ + (int)other->used_bigits_;
  if (iVar9 < iVar3) {
    iVar9 = iVar3;
  }
  EnsureCapacity((iVar9 - this->exponent_) + 1);
  lVar7 = (long)other->exponent_;
  sVar8 = this->exponent_;
  sVar1 = this->used_bigits_;
  lVar4 = (long)sVar1;
  for (lVar10 = lVar4; lVar10 < lVar7 - sVar8; lVar10 = lVar10 + 1) {
    this->bigits_buffer_[lVar10] = 0;
  }
  uVar2 = other->used_bigits_;
  uVar6 = 0;
  if ((short)uVar2 < 1) {
    uVar2 = 0;
  }
  lVar10 = lVar7 * 4 + (long)(int)sVar8 * -4 + 4;
  uVar12 = 0;
  for (; lVar11 = -(int)sVar8 + lVar7 + uVar6, uVar2 != uVar6; uVar6 = uVar6 + 1) {
    iVar9 = 0;
    if (lVar11 < lVar4) {
      iVar9 = *(int *)((long)this + uVar6 * 4 + lVar10);
    }
    uVar12 = iVar9 + uVar12 + other->bigits_buffer_[uVar6];
    *(uint *)((long)this + uVar6 * 4 + lVar10) = uVar12 & 0xfffffff;
    uVar12 = uVar12 >> 0x1c;
  }
  for (; uVar12 != 0; uVar12 = CVar5 + uVar12 >> 0x1c) {
    CVar5 = 0;
    if (lVar11 < lVar4) {
      CVar5 = this->bigits_buffer_[lVar11];
    }
    this->bigits_buffer_[lVar11] = CVar5 + uVar12 & 0xfffffff;
    lVar11 = lVar11 + 1;
  }
  sVar8 = (short)lVar11;
  if ((int)lVar11 <= (int)sVar1) {
    sVar8 = sVar1;
  }
  this->used_bigits_ = sVar8;
  return;
}

Assistant:

void Bignum::AddBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());

  // If this has a greater exponent than other append zero-bigits to this.
  // After this call exponent_ <= other.exponent_.
  Align(other);

  // There are two possibilities:
  //   aaaaaaaaaaa 0000  (where the 0s represent a's exponent)
  //     bbbbb 00000000
  //   ----------------
  //   ccccccccccc 0000
  // or
  //    aaaaaaaaaa 0000
  //  bbbbbbbbb 0000000
  //  -----------------
  //  cccccccccccc 0000
  // In both cases we might need a carry bigit.

  EnsureCapacity(1 + (std::max)(BigitLength(), other.BigitLength()) - exponent_);
  Chunk carry = 0;
  int bigit_pos = other.exponent_ - exponent_;
  DOUBLE_CONVERSION_ASSERT(bigit_pos >= 0);
  for (int i = used_bigits_; i < bigit_pos; ++i) {
    RawBigit(i) = 0;
  }
  for (int i = 0; i < other.used_bigits_; ++i) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + other.RawBigit(i) + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  while (carry != 0) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  used_bigits_ = static_cast<int16_t>(std::max(bigit_pos, static_cast<int>(used_bigits_)));
  DOUBLE_CONVERSION_ASSERT(IsClamped());
}